

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O2

bool __thiscall Ptex::v2_2::StringKey::matches(StringKey *this,StringKey *key)

{
  bool bVar1;
  
  if (((key->_hash == this->_hash) && (key->_len == this->_len)) && (this->_val != (char *)0x0)) {
    bVar1 = memCompare(key->_val,this->_val,this->_len);
    return !bVar1;
  }
  return false;
}

Assistant:

bool matches(const StringKey& key) volatile
    {
        return key._hash == _hash && key._len == _len && _val && 0 == memCompare(key._val, _val, _len);
    }